

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

ByteArray * __thiscall
EncodingTable::encodeTermination(ByteArray *__return_storage_ptr__,EncodingTable *this)

{
  byte *pbVar1;
  ulong local_30;
  size_t i;
  TableEntry *entry;
  EncodingTable *this_local;
  ByteArray *result;
  
  ByteArray::ByteArray(__return_storage_ptr__);
  for (local_30 = 0; local_30 < (this->terminationEntry).hexLen; local_30 = local_30 + 1) {
    pbVar1 = ByteArray::operator[](&this->hexData,(this->terminationEntry).hexPos + local_30);
    ByteArray::appendByte(__return_storage_ptr__,*pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray EncodingTable::encodeTermination()
{
	ByteArray result;

	TableEntry& entry = terminationEntry;
	for (size_t i = 0; i < entry.hexLen; i++)
	{
		result.appendByte(hexData[entry.hexPos+i]);
	}

	return result;
}